

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::GoogleTestFailureReporter::ReportFailure
          (GoogleTestFailureReporter *this,FailureType type,char *file,int line,string *message)

{
  undefined4 in_ECX;
  AssertHelper *in_RDX;
  int in_ESI;
  undefined8 in_R8;
  Message *in_stack_00000028;
  char *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  Type type_00;
  undefined4 in_stack_ffffffffffffffe0;
  
  type_00 = (Type)((ulong)in_R8 >> 0x20);
  Message::Message((Message *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  std::__cxx11::string::c_str();
  AssertHelper::AssertHelper
            ((AssertHelper *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),type_00,
             in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0);
  AssertHelper::operator=((AssertHelper *)message,in_stack_00000028);
  AssertHelper::~AssertHelper(in_RDX);
  Message::~Message((Message *)0x149e05);
  if (in_ESI == 1) {
    posix::Abort();
  }
  return;
}

Assistant:

virtual void ReportFailure(FailureType type, const char* file, int line,
                             const string& message) {
    AssertHelper(type == kFatal ?
                 TestPartResult::kFatalFailure :
                 TestPartResult::kNonFatalFailure,
                 file,
                 line,
                 message.c_str()) = Message();
    if (type == kFatal) {
      posix::Abort();
    }
  }